

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RedBlackTree.cpp
# Opt level: O3

void __thiscall RedBlackTree::rotateRight(RedBlackTree *this,Node **ptr)

{
  Node *pNVar1;
  Node *pNVar2;
  
  pNVar1 = (*ptr)->left;
  (*ptr)->left = pNVar1->right;
  pNVar2 = *ptr;
  if (pNVar2->left != (Node *)0x0) {
    pNVar2->left->parent = pNVar2;
    pNVar2 = *ptr;
  }
  pNVar1->parent = pNVar2->parent;
  pNVar2 = (*ptr)->parent;
  if (pNVar2 != (Node *)0x0) {
    this = (RedBlackTree *)&pNVar2->right;
    if (*ptr == pNVar2->left) {
      this = (RedBlackTree *)&pNVar2->left;
    }
  }
  *this = (RedBlackTree)pNVar1;
  pNVar2 = *ptr;
  pNVar1->right = pNVar2;
  pNVar2->parent = pNVar1;
  return;
}

Assistant:

void RedBlackTree::rotateRight(Node *&ptr) {
    Node *left_child = ptr->left;
    ptr->left = left_child->right;

    if (ptr->left != nullptr) {
        ptr->left->parent = ptr;
    }
    left_child->parent = ptr->parent;

    if (ptr->parent == nullptr) {
        root = left_child;
    } else if (ptr == ptr->parent->left) {
        ptr->parent->left = left_child;
    } else {
        ptr->parent->right = left_child;
    }

    left_child->right = ptr;
    ptr->parent = left_child;
}